

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O2

wchar_t process_head_file(archive_read *a,rar5 *rar,archive_entry *entry,size_t block_flags)

{
  int64_t *piVar1;
  ulong uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  uint64_t uVar6;
  size_t sVar7;
  uint64_t uVar8;
  char cVar9;
  byte bVar10;
  byte bVar11;
  wchar_t wVar12;
  wchar_t wVar13;
  uint8_t *puVar14;
  undefined8 *__ptr;
  undefined8 *puVar15;
  char *pcVar16;
  size_t sVar17;
  int iVar18;
  uint uVar19;
  ulong __size;
  long lVar20;
  uint64_t local_4128;
  uint64_t local_4120;
  uint64_t value_size;
  size_t name_size_1;
  uint64_t id;
  size_t file_flags;
  size_t value_len;
  size_t sStack_40f0;
  size_t local_40e8;
  uint32_t crc;
  uint32_t mtime;
  uint32_t *local_40d8;
  uint32_t *local_40d0;
  uint32_t *local_40c8;
  size_t file_attr;
  size_t name_size;
  uint64_t local_40b0;
  uint8_t *local_40a8;
  int64_t *local_40a0;
  int64_t *local_4098;
  int64_t *local_4090;
  uint64_t *local_4088;
  uint64_t *local_4080;
  size_t host_os;
  size_t compression_info;
  size_t data_size;
  uint64_t extra_field_id;
  uint64_t extra_field_size;
  uint8_t *local_4050;
  uint8_t *p;
  uint64_t unpacked_size;
  uint64_t edata_size;
  size_t sStack_4030;
  size_t local_4028;
  char name_utf8_buf [8192];
  
  data_size = 0;
  file_flags = 0;
  file_attr = 0;
  compression_info = 0;
  host_os = 0;
  name_size = 0;
  mtime = 0;
  crc = 0;
  archive_entry_clear(entry);
  if ((undefined1  [19312])((undefined1  [19312])rar->cstate & (undefined1  [19312])0x4) ==
      (undefined1  [19312])0x0) {
    memset(&rar->file,0,0x770);
    blake2sp_init(&(rar->file).b2state,0x20);
    if (((ulong)rar->main & 1) == 0) {
      (rar->cstate).solid_offset = 0;
    }
    else {
      piVar1 = &(rar->cstate).solid_offset;
      *piVar1 = *piVar1 + (rar->cstate).write_ptr;
    }
    (rar->cstate).write_ptr = 0;
    (rar->cstate).last_write_ptr = 0;
    (rar->cstate).last_unstore_ptr = 0;
    (rar->file).redir_type = 0;
    (rar->file).redir_flags = 0;
    free_filters(rar);
  }
  if ((block_flags & 1) == 0) {
    local_4128 = 0;
  }
  else {
    edata_size = 0;
    wVar12 = read_var(a,&edata_size,(uint64_t *)0x0);
    local_4128 = edata_size;
    if (wVar12 == L'\0') {
      return L'\x01';
    }
  }
  if ((block_flags & 2) == 0) {
    (rar->file).bytes_remaining = 0;
    pcVar16 = "no data found in file/service block";
  }
  else {
    wVar12 = read_var_sized(a,&data_size,(size_t *)0x0);
    if (wVar12 == L'\0') {
      return L'\x01';
    }
    (rar->file).bytes_remaining = data_size;
    wVar12 = read_var_sized(a,&file_flags,(size_t *)0x0);
    if (wVar12 == L'\0') {
      return L'\x01';
    }
    wVar12 = read_var(a,&unpacked_size,(uint64_t *)0x0);
    if (wVar12 == L'\0') {
      return L'\x01';
    }
    if ((file_flags & 8) != 0) {
      pcVar16 = "Files with unknown unpacked size are not supported";
LAB_00142a06:
      iVar18 = 0x16;
      goto LAB_001428a4;
    }
    (rar->file).field_0x20 = (rar->file).field_0x20 & 0xf7 | ((byte)file_flags & 1) << 3;
    wVar12 = read_var_sized(a,&file_attr,(size_t *)0x0);
    if (wVar12 == L'\0') {
      return L'\x01';
    }
    if (((file_flags & 2) != 0) && (cVar9 = read_u32(a,&mtime), cVar9 == '\0')) {
      return L'\x01';
    }
    if (((file_flags & 4) != 0) && (cVar9 = read_u32(a,&crc), cVar9 == '\0')) {
      return L'\x01';
    }
    wVar12 = read_var_sized(a,&compression_info,(size_t *)0x0);
    if (wVar12 == L'\0') {
      return L'\x01';
    }
    bVar10 = (rar->file).field_0x20;
    __size = 0;
    if ((bVar10 & 8) == 0) {
      __size = 0x20000L << ((byte)(compression_info >> 10) & 0xf);
    }
    (rar->cstate).method = (uint)(compression_info >> 7) & 7;
    (rar->cstate).version = ((uint)compression_info & 0x3f) + L'2';
    bVar11 = (byte)compression_info >> 6 & 1;
    bVar10 = bVar10 & 0xfe | bVar11;
    (rar->file).field_0x20 = bVar10;
    if (bVar11 == 0) {
      if (__size < 0x4000001) {
LAB_00142a3b:
        *(byte *)&rar->cstate = *(byte *)&rar->cstate & 0xef;
LAB_00142a3f:
        if (((rar->cstate).window_size < (long)__size) &&
           (puVar14 = (rar->cstate).window_buf, puVar14 != (uint8_t *)0x0)) {
          (rar->cstate).dready[1].size = 0;
          (rar->cstate).dready[1].offset = 0;
          *(undefined8 *)((rar->cstate).dready + 1) = 0;
          (rar->cstate).dready[1].buf = (uint8_t *)0x0;
          (rar->cstate).dready[0].size = 0;
          (rar->cstate).dready[0].offset = 0;
          *(undefined8 *)(rar->cstate).dready = 0;
          (rar->cstate).dready[0].buf = (uint8_t *)0x0;
          puVar14 = (uint8_t *)realloc(puVar14,__size);
          if (puVar14 == (uint8_t *)0x0) {
            pcVar16 = "Not enough memory when trying to realloc the window buffer.";
            goto LAB_00142a06;
          }
          (rar->cstate).window_buf = puVar14;
          bVar10 = (rar->file).field_0x20;
        }
        (rar->cstate).window_size = __size;
        if (((bVar10 & 1) != 0) && ((rar->file).solid_window_size == 0)) {
          (rar->file).solid_window_size = __size;
        }
        lVar20 = __size - 1;
        if (__size == 0) {
          lVar20 = 0;
        }
        (rar->cstate).window_mask = lVar20;
        (rar->file).field_0x20 = bVar10 & 0xfd;
        wVar12 = read_var_sized(a,&host_os,(size_t *)0x0);
        if (wVar12 == L'\0') {
          return L'\x01';
        }
        if (host_os == 1) {
          archive_entry_set_mode(entry,(mode_t)file_attr);
        }
        else {
          if (host_os != 0) {
            archive_set_error(&a->archive,0x54,"Unsupported Host OS: 0x%jx");
            return L'\xffffffe2';
          }
          uVar19 = 0x416d;
          if ((file_attr & 0x10) == 0) {
            uVar19 = 0x8124;
          }
          archive_entry_set_mode(entry,uVar19 | (uint)((file_attr & 1) == 0) << 7);
          sVar7 = file_attr;
          if (((file_attr & 7) != 0) &&
             (__ptr = (undefined8 *)malloc(0x16), __ptr != (undefined8 *)0x0)) {
            puVar15 = __ptr;
            if ((sVar7 & 1) != 0) {
              *__ptr = 0x796c6e6f64722c;
              puVar15 = (undefined8 *)((long)__ptr + 7);
            }
            if ((sVar7 & 2) != 0) {
              *puVar15 = 0x6e65646469682c;
              puVar15 = (undefined8 *)((long)puVar15 + 7);
            }
            if ((sVar7 & 4) != 0) {
              *puVar15 = 0x6d65747379732c;
              puVar15 = (undefined8 *)((long)puVar15 + 7);
            }
            if (__ptr < puVar15) {
              archive_entry_copy_fflags_text(entry,(char *)((long)__ptr + 1));
            }
            free(__ptr);
          }
        }
        wVar12 = read_var_sized(a,&name_size,(size_t *)0x0);
        if (wVar12 == L'\0') {
          return L'\x01';
        }
        if (name_size < 0x800) {
          if (name_size != 0) {
            wVar12 = read_ahead(a,name_size,&p);
            sVar7 = name_size;
            if (wVar12 == L'\0') {
              return L'\x01';
            }
            memcpy(name_utf8_buf,p,name_size);
            name_utf8_buf[sVar7] = '\0';
            wVar12 = consume(a,sVar7);
            if (wVar12 != L'\0') {
              return L'\x01';
            }
            archive_entry_update_pathname_utf8(entry,name_utf8_buf);
            if ((long)local_4128 < 1) {
LAB_001436ce:
              if (((file_flags & 8) == 0) &&
                 ((rar->file).unpacked_size = unpacked_size, (rar->file).redir_type == 0)) {
                archive_entry_set_size(entry,unpacked_size);
              }
              if ((file_flags & 2) != 0) {
                archive_entry_set_mtime(entry,(ulong)mtime,0);
              }
              if ((file_flags & 4) != 0) {
                (rar->file).stored_crc32 = crc;
              }
              if ((*(byte *)&rar->cstate & 4) == 0) {
                *(byte *)&rar->cstate = *(byte *)&rar->cstate & 0xf0 | 10;
              }
              if ((undefined1  [12])((undefined1  [12])rar->generic & (undefined1  [12])0x2) ==
                  (undefined1  [12])0x0) {
                return L'\0';
              }
              return L'\xfffffff6';
            }
            extra_field_id = 0;
            local_4080 = &(rar->file).redir_type;
            local_4088 = &(rar->file).redir_flags;
            local_40c8 = &(rar->file).e_mtime_ns;
            local_40d0 = &(rar->file).e_ctime_ns;
            local_40d8 = &(rar->file).e_atime_ns;
            local_4090 = &(rar->file).e_mtime;
            local_4098 = &(rar->file).e_ctime;
            local_40a0 = &(rar->file).e_atime;
            local_4050 = (rar->file).blake2sp;
LAB_00142d31:
            wVar12 = L'\xffffffe2';
LAB_00142d34:
            if ((long)local_4128 < 1) {
              if (wVar12 != L'\0') {
                return wVar12;
              }
              goto LAB_001436ce;
            }
            wVar13 = read_var(a,&extra_field_size,&local_40b0);
            uVar6 = local_40b0;
            if (wVar13 == L'\0') {
              return L'\x01';
            }
            wVar13 = consume(a,local_40b0);
            if (wVar13 != L'\0') {
              return L'\x01';
            }
            wVar13 = read_var(a,&extra_field_id,&local_40b0);
            uVar8 = local_40b0;
            if (wVar13 == L'\0') {
              return L'\x01';
            }
            extra_field_size = extra_field_size - local_40b0;
            wVar13 = consume(a,local_40b0);
            if (wVar13 != L'\0') {
              return L'\x01';
            }
            local_4128 = local_4128 - (uVar6 + uVar8);
            switch(extra_field_id) {
            case 1:
              archive_entry_set_is_data_encrypted(entry,'\x01');
              rar->has_encrypted_entries = L'\x01';
              *(byte *)&rar->cstate = *(byte *)&rar->cstate | 0x10;
            default:
              local_4128 = local_4128 - extra_field_size;
              wVar13 = consume(a,extra_field_size);
              if (wVar13 != L'\0') {
                return L'\x01';
              }
              goto LAB_00142d34;
            case 2:
              edata_size = 0;
              local_4120 = local_4128;
              wVar12 = read_var_sized(a,&edata_size,&value_len);
              if (wVar12 == L'\0') break;
              local_4128 = local_4128 - value_len;
              local_4120 = local_4128;
              wVar12 = consume(a,value_len);
              if (wVar12 == L'\0') {
                if (edata_size != 0) {
                  archive_set_error(&a->archive,0x54,"Unsupported hash type (0x%jx)");
                  goto LAB_00142d31;
                }
                wVar12 = read_ahead(a,0x20,(uint8_t **)&value_size);
                if (wVar12 != L'\0') {
                  (rar->file).has_blake2 = '\x01';
                  uVar3 = *(undefined8 *)value_size;
                  uVar4 = *(undefined8 *)(value_size + 8);
                  uVar5 = *(undefined8 *)(value_size + 0x18);
                  *(undefined8 *)(local_4050 + 0x10) = *(undefined8 *)(value_size + 0x10);
                  *(undefined8 *)(local_4050 + 0x18) = uVar5;
                  *(undefined8 *)local_4050 = uVar3;
                  *(undefined8 *)(local_4050 + 8) = uVar4;
                  wVar12 = consume(a,0x20);
                  if (wVar12 == L'\0') {
                    local_4128 = local_4128 - 0x20;
                    wVar12 = L'\0';
                    local_4120 = local_4128;
                    goto LAB_00142d34;
                  }
                }
              }
              break;
            case 3:
              edata_size = 0;
              local_4120 = local_4128;
              wVar13 = read_var_sized(a,&edata_size,&value_len);
              wVar12 = L'\x01';
              if (wVar13 != L'\0') {
                local_4120 = local_4128 - value_len;
                wVar13 = consume(a,value_len);
                uVar6 = edata_size;
                wVar12 = L'\x01';
                if (wVar13 == L'\0') {
                  *local_40c8 = 0;
                  *local_40d0 = 0;
                  *local_40d8 = 0;
                  uVar19 = (uint)edata_size;
                  bVar10 = (byte)edata_size;
                  bVar11 = bVar10 & 1;
                  if ((edata_size & 2) != 0) {
                    parse_htime_item(a,bVar11,local_4090,local_40c8,(int64_t *)&local_4120);
                  }
                  if ((uVar6 & 4) != 0) {
                    parse_htime_item(a,bVar11,local_4098,local_40d0,(int64_t *)&local_4120);
                  }
                  if ((uVar6 & 8) != 0) {
                    parse_htime_item(a,bVar11,local_40a0,local_40d8,(int64_t *)&local_4120);
                  }
                  bVar10 = (byte)((uVar19 & 0x10) >> 4) & bVar10 ^ 1;
                  if ((uVar6 & 2) != 0 && bVar10 == 0) {
                    cVar9 = read_u32(a,local_40c8);
                    wVar12 = L'\x01';
                    if (cVar9 == '\0') goto LAB_00142f3d;
                    local_4120 = local_4120 - 4;
                  }
                  if ((uVar6 & 4) != 0 && bVar10 == 0) {
                    cVar9 = read_u32(a,local_40d0);
                    wVar12 = L'\x01';
                    if (cVar9 == '\0') goto LAB_00142f3d;
                    local_4120 = local_4120 - 4;
                  }
                  if ((uVar6 & 8) != 0 && bVar10 == 0) {
                    cVar9 = read_u32(a,local_40d8);
                    wVar12 = L'\x01';
                    if (cVar9 == '\0') goto LAB_00142f3d;
                    local_4120 = local_4120 - 4;
                  }
                  if ((uVar6 & 2) != 0) {
                    archive_entry_set_mtime(entry,*local_4090,(ulong)*local_40c8);
                  }
                  if ((uVar6 & 4) != 0) {
                    archive_entry_set_ctime(entry,*local_4098,(ulong)*local_40d0);
                  }
                  wVar12 = L'\0';
                  if ((uVar6 & 8) != 0) {
                    archive_entry_set_atime(entry,*local_40a0,(ulong)*local_40d8);
                  }
                }
              }
LAB_00142f3d:
              local_4128 = local_4120;
              goto LAB_00142d34;
            case 4:
              value_size = 0;
              id = 0;
              name_size_1 = 0;
              local_4120 = local_4128;
              wVar12 = read_var_sized(a,&value_size,&name_size_1);
              if (wVar12 == L'\0') break;
              local_4128 = local_4128 - name_size_1;
              local_4120 = local_4128;
              wVar12 = consume(a,name_size_1);
              if ((wVar12 != L'\0') ||
                 (wVar12 = read_var_sized(a,&id,&name_size_1), wVar12 == L'\0')) break;
              local_4128 = local_4128 - name_size_1;
              local_4120 = local_4128;
              wVar12 = consume(a,name_size_1);
              if (wVar12 != L'\0') break;
              pcVar16 = archive_entry_pathname_utf8(entry);
              if (pcVar16 != (char *)0x0) {
                edata_size = 0;
                sStack_4030 = 0;
                local_4028 = 0;
                value_len = 0;
                sStack_40f0 = 0;
                local_40e8 = 0;
                wVar12 = L'\0';
                archive_string_sprintf((archive_string *)&edata_size,";%zu",id);
                archive_strcat((archive_string *)&value_len,pcVar16);
                archive_strcat((archive_string *)&value_len,(void *)edata_size);
                archive_entry_update_pathname_utf8(entry,(char *)value_len);
                archive_string_free((archive_string *)&edata_size);
                archive_string_free((archive_string *)&value_len);
                goto LAB_00142d34;
              }
              iVar18 = 0x16;
              pcVar16 = "Version entry without file name";
LAB_00143696:
              archive_set_error(&a->archive,iVar18,pcVar16);
              goto LAB_00142d31;
            case 5:
              value_len = 0;
              value_size = 0;
              local_4120 = local_4128;
              wVar12 = read_var(a,local_4080,&value_len);
              if ((wVar12 != L'\0') && (wVar12 = consume(a,value_len), wVar12 == L'\0')) {
                local_4128 = local_4128 - value_len;
                local_4120 = local_4128;
                wVar12 = read_var(a,local_4088,&value_len);
                if ((wVar12 != L'\0') && (wVar12 = consume(a,value_len), wVar12 == L'\0')) {
                  local_4128 = local_4128 - value_len;
                  local_4120 = local_4128;
                  wVar12 = read_var_sized(a,&value_size,(size_t *)0x0);
                  if (wVar12 != L'\0') {
                    local_4128 = local_4128 + ~value_size;
                    local_4120 = local_4128;
                    if (0x7ff < value_size) {
                      iVar18 = 0x54;
                      pcVar16 = "Link target is too long";
                      goto LAB_00143696;
                    }
                    if (value_size == 0) {
                      iVar18 = 0x54;
                      pcVar16 = "No link target specified";
                      goto LAB_00143696;
                    }
                    wVar12 = read_ahead(a,value_size,(uint8_t **)&id);
                    uVar6 = value_size;
                    if (wVar12 != L'\0') {
                      memcpy(&edata_size,(void *)id,value_size);
                      *(undefined1 *)((long)&edata_size + uVar6) = 0;
                      wVar12 = consume(a,uVar6);
                      if (wVar12 == L'\0') {
                        wVar12 = L'\0';
                        if (*local_4080 - 1 < 2) {
                          archive_entry_set_filetype(entry,0xa000);
                          archive_entry_update_symlink_utf8(entry,(char *)&edata_size);
                          if ((*local_4088 & 1) == 0) {
                            archive_entry_set_symlink_type(entry,L'\x01');
                          }
                          else {
                            archive_entry_set_symlink_type(entry,L'\x02');
                          }
                        }
                        else if (*local_4080 == 4) {
                          archive_entry_set_filetype(entry,0x8000);
                          archive_entry_update_hardlink_utf8(entry,(char *)&edata_size);
                        }
                        goto LAB_00142d34;
                      }
                    }
                  }
                }
              }
              break;
            case 6:
              value_len = 0;
              value_size = 0;
              id = 0;
              name_size_1 = 0;
              local_4120 = local_4128;
              wVar12 = read_var(a,&value_len,&value_size);
              if ((wVar12 == L'\0') || (wVar12 = consume(a,value_size), wVar12 != L'\0')) break;
              local_4128 = local_4128 - value_size;
              local_4120 = local_4128;
              if ((value_len & 1) != 0) {
                wVar12 = read_var_sized(a,&name_size_1,(size_t *)0x0);
                if (wVar12 != L'\0') {
                  local_4128 = local_4128 + ~name_size_1;
                  local_4120 = local_4128;
                  wVar12 = read_ahead(a,name_size_1,&local_40a8);
                  sVar7 = name_size_1;
                  if (wVar12 != L'\0') {
                    sVar17 = 0xff;
                    if (name_size_1 < 0xff) {
                      sVar17 = name_size_1;
                    }
                    memcpy(&edata_size,local_40a8,sVar17);
                    *(undefined1 *)((long)&edata_size + sVar17) = 0;
                    wVar12 = consume(a,sVar7);
                    if (wVar12 == L'\0') {
                      archive_entry_set_uname(entry,(char *)&edata_size);
                      goto LAB_00142fba;
                    }
                  }
                }
                break;
              }
LAB_00142fba:
              if ((value_len & 2) != 0) {
                wVar12 = read_var_sized(a,&name_size_1,(size_t *)0x0);
                if (wVar12 != L'\0') {
                  local_4128 = local_4128 + ~name_size_1;
                  local_4120 = local_4128;
                  wVar12 = read_ahead(a,name_size_1,&local_40a8);
                  sVar7 = name_size_1;
                  if (wVar12 != L'\0') {
                    sVar17 = 0xff;
                    if (name_size_1 < 0xff) {
                      sVar17 = name_size_1;
                    }
                    memcpy(&edata_size,local_40a8,sVar17);
                    *(undefined1 *)((long)&edata_size + sVar17) = 0;
                    wVar12 = consume(a,sVar7);
                    if (wVar12 == L'\0') {
                      archive_entry_set_gname(entry,(char *)&edata_size);
                      goto LAB_00142fc2;
                    }
                  }
                }
                break;
              }
LAB_00142fc2:
              if ((value_len & 4) != 0) {
                wVar12 = read_var(a,&id,&value_size);
                if ((wVar12 == L'\0') || (wVar12 = consume(a,value_size), wVar12 != L'\0')) break;
                local_4128 = local_4128 - value_size;
                local_4120 = local_4128;
                archive_entry_set_uid(entry,id);
              }
              wVar12 = L'\0';
              if ((value_len & 8) == 0) goto LAB_00142d34;
              wVar13 = read_var(a,&id,&value_size);
              if ((wVar13 != L'\0') && (wVar13 = consume(a,value_size), wVar13 == L'\0')) {
                local_4128 = local_4128 - value_size;
                local_4120 = local_4128;
                archive_entry_set_gid(entry,id);
                goto LAB_00142d34;
              }
            }
            wVar12 = L'\x01';
            goto LAB_00142d34;
          }
          pcVar16 = "No filename specified";
        }
        else {
          pcVar16 = "Filename is too long";
        }
      }
      else {
LAB_00142a27:
        pcVar16 = "Declared dictionary size is not supported.";
      }
    }
    else if (((undefined1  [19312])((undefined1  [19312])rar->cstate & (undefined1  [19312])0x10) ==
              (undefined1  [19312])0x0) && ((rar->cstate).window_buf == (uint8_t *)0x0)) {
      pcVar16 = "Declared solid file, but no window buffer initialized yet.";
    }
    else {
      if (0x4000000 < __size) goto LAB_00142a27;
      if (bVar11 == 0) goto LAB_00142a3b;
      uVar2 = (rar->file).solid_window_size;
      if (((long)uVar2 < 1) || (uVar2 == __size)) goto LAB_00142a3f;
      pcVar16 = 
      "Window size for this solid file doesn\'t match the window size used in previous solid file. "
      ;
    }
  }
  iVar18 = 0x54;
LAB_001428a4:
  archive_set_error(&a->archive,iVar18,pcVar16);
  return L'\xffffffe2';
}

Assistant:

static int process_head_file(struct archive_read* a, struct rar5* rar,
    struct archive_entry* entry, size_t block_flags)
{
	int64_t extra_data_size = 0;
	size_t data_size = 0;
	size_t file_flags = 0;
	size_t file_attr = 0;
	size_t compression_info = 0;
	size_t host_os = 0;
	size_t name_size = 0;
	uint64_t unpacked_size, window_size;
	uint32_t mtime = 0, crc = 0;
	int c_method = 0, c_version = 0;
	char name_utf8_buf[MAX_NAME_IN_BYTES];
	const uint8_t* p;

	enum FILE_FLAGS {
		DIRECTORY = 0x0001, UTIME = 0x0002, CRC32 = 0x0004,
		UNKNOWN_UNPACKED_SIZE = 0x0008,
	};

	enum FILE_ATTRS {
		ATTR_READONLY = 0x1, ATTR_HIDDEN = 0x2, ATTR_SYSTEM = 0x4,
		ATTR_DIRECTORY = 0x10,
	};

	enum COMP_INFO_FLAGS {
		SOLID = 0x0040,
	};

	enum HOST_OS {
		HOST_WINDOWS = 0,
		HOST_UNIX = 1,
	};

	archive_entry_clear(entry);

	/* Do not reset file context if we're switching archives. */
	if(!rar->cstate.switch_multivolume) {
		reset_file_context(rar);
	}

	if(block_flags & HFL_EXTRA_DATA) {
		uint64_t edata_size = 0;
		if(!read_var(a, &edata_size, NULL))
			return ARCHIVE_EOF;

		/* Intentional type cast from unsigned to signed. */
		extra_data_size = (int64_t) edata_size;
	}

	if(block_flags & HFL_DATA) {
		if(!read_var_sized(a, &data_size, NULL))
			return ARCHIVE_EOF;

		rar->file.bytes_remaining = data_size;
	} else {
		rar->file.bytes_remaining = 0;

		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
				"no data found in file/service block");
		return ARCHIVE_FATAL;
	}

	if(!read_var_sized(a, &file_flags, NULL))
		return ARCHIVE_EOF;

	if(!read_var(a, &unpacked_size, NULL))
		return ARCHIVE_EOF;

	if(file_flags & UNKNOWN_UNPACKED_SIZE) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_PROGRAMMER,
		    "Files with unknown unpacked size are not supported");
		return ARCHIVE_FATAL;
	}

	rar->file.dir = (uint8_t) ((file_flags & DIRECTORY) > 0);

	if(!read_var_sized(a, &file_attr, NULL))
		return ARCHIVE_EOF;

	if(file_flags & UTIME) {
		if(!read_u32(a, &mtime))
			return ARCHIVE_EOF;
	}

	if(file_flags & CRC32) {
		if(!read_u32(a, &crc))
			return ARCHIVE_EOF;
	}

	if(!read_var_sized(a, &compression_info, NULL))
		return ARCHIVE_EOF;

	c_method = (int) (compression_info >> 7) & 0x7;
	c_version = (int) (compression_info & 0x3f);

	/* RAR5 seems to limit the dictionary size to 64MB. */
	window_size = (rar->file.dir > 0) ?
		0 :
		g_unpack_window_size << ((compression_info >> 10) & 15);
	rar->cstate.method = c_method;
	rar->cstate.version = c_version + 50;
	rar->file.solid = (compression_info & SOLID) > 0;

	/* Archives which declare solid files without initializing the window
	 * buffer first are invalid, unless previous data was encrypted, in
	 * which case we may never have had the chance */

	if(rar->file.solid > 0 && rar->cstate.data_encrypted == 0 &&
	    rar->cstate.window_buf == NULL) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
				  "Declared solid file, but no window buffer "
				  "initialized yet.");
		return ARCHIVE_FATAL;
	}

	/* Check if window_size is a sane value. Also, if the file is not
	 * declared as a directory, disallow window_size == 0. */
	if(window_size > (64 * 1024 * 1024) ||
	    (rar->file.dir == 0 && window_size == 0))
	{
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Declared dictionary size is not supported.");
		return ARCHIVE_FATAL;
	}

	if(rar->file.solid > 0) {
		/* Re-check if current window size is the same as previous
		 * window size (for solid files only). */
		if(rar->file.solid_window_size > 0 &&
		    rar->file.solid_window_size != (ssize_t) window_size)
		{
			archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
			    "Window size for this solid file doesn't match "
			    "the window size used in previous solid file. ");
			return ARCHIVE_FATAL;
		}
	}
	else
		rar->cstate.data_encrypted = 0; /* Reset for new buffer */

	if(rar->cstate.window_size < (ssize_t) window_size &&
	    rar->cstate.window_buf)
	{
		/* The `data_ready` stack contains pointers to the `window_buf` or
		 * `filtered_buf` buffers.  Since we're about to reallocate the first
		 * buffer, some of those pointers could become invalid. Therefore, we
		 * need to dispose of all entries from the stack before attempting the
		 * realloc. */
		clear_data_ready_stack(rar);

		/* If window_buf has been allocated before, reallocate it, so
		 * that its size will match new window_size. */

		uint8_t* new_window_buf =
			realloc(rar->cstate.window_buf, (size_t) window_size);

		if(!new_window_buf) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_PROGRAMMER,
				"Not enough memory when trying to realloc the window "
				"buffer.");
			return ARCHIVE_FATAL;
		}

		rar->cstate.window_buf = new_window_buf;
	}

	/* Values up to 64M should fit into ssize_t on every
	 * architecture. */
	rar->cstate.window_size = (ssize_t) window_size;

	if(rar->file.solid > 0 && rar->file.solid_window_size == 0) {
		/* Solid files have to have the same window_size across
		   whole archive. Remember the window_size parameter
		   for first solid file found. */
		rar->file.solid_window_size = rar->cstate.window_size;
	}

	init_window_mask(rar);

	rar->file.service = 0;

	if(!read_var_sized(a, &host_os, NULL))
		return ARCHIVE_EOF;

	if(host_os == HOST_WINDOWS) {
		/* Host OS is Windows */

		__LA_MODE_T mode;

		if(file_attr & ATTR_DIRECTORY) {
			if (file_attr & ATTR_READONLY) {
				mode = 0555 | AE_IFDIR;
			} else {
				mode = 0755 | AE_IFDIR;
			}
		} else {
			if (file_attr & ATTR_READONLY) {
				mode = 0444 | AE_IFREG;
			} else {
				mode = 0644 | AE_IFREG;
			}
		}

		archive_entry_set_mode(entry, mode);

		if (file_attr & (ATTR_READONLY | ATTR_HIDDEN | ATTR_SYSTEM)) {
			char *fflags_text, *ptr;
			/* allocate for ",rdonly,hidden,system" */
			fflags_text = malloc(22 * sizeof(*fflags_text));
			if (fflags_text != NULL) {
				ptr = fflags_text;
				if (file_attr & ATTR_READONLY) {
					strcpy(ptr, ",rdonly");
					ptr = ptr + 7;
				}
				if (file_attr & ATTR_HIDDEN) {
					strcpy(ptr, ",hidden");
					ptr = ptr + 7;
				}
				if (file_attr & ATTR_SYSTEM) {
					strcpy(ptr, ",system");
					ptr = ptr + 7;
				}
				if (ptr > fflags_text) {
					archive_entry_copy_fflags_text(entry,
					    fflags_text + 1);
				}
				free(fflags_text);
			}
		}
	} else if(host_os == HOST_UNIX) {
		/* Host OS is Unix */
		archive_entry_set_mode(entry, (__LA_MODE_T) file_attr);
	} else {
		/* Unknown host OS */
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
				"Unsupported Host OS: 0x%jx",
				(uintmax_t)host_os);

		return ARCHIVE_FATAL;
	}

	if(!read_var_sized(a, &name_size, NULL))
		return ARCHIVE_EOF;

	if(name_size > (MAX_NAME_IN_CHARS - 1)) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
				"Filename is too long");

		return ARCHIVE_FATAL;
	}

	if(name_size == 0) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
				"No filename specified");

		return ARCHIVE_FATAL;
	}

	if(!read_ahead(a, name_size, &p))
		return ARCHIVE_EOF;

	memcpy(name_utf8_buf, p, name_size);
	name_utf8_buf[name_size] = 0;
	if(ARCHIVE_OK != consume(a, name_size)) {
		return ARCHIVE_EOF;
	}

	archive_entry_update_pathname_utf8(entry, name_utf8_buf);

	if(extra_data_size > 0) {
		int ret = process_head_file_extra(a, entry, rar,
		    extra_data_size);

		/*
		 * TODO: rewrite or remove useless sanity check
		 *       as extra_data_size is not passed as a pointer
		 *
		if(extra_data_size < 0) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_PROGRAMMER,
			    "File extra data size is not zero");
			return ARCHIVE_FATAL;
		}
		 */

		if(ret != ARCHIVE_OK)
			return ret;
	}

	if((file_flags & UNKNOWN_UNPACKED_SIZE) == 0) {
		rar->file.unpacked_size = (ssize_t) unpacked_size;
		if(rar->file.redir_type == REDIR_TYPE_NONE)
			archive_entry_set_size(entry, unpacked_size);
	}

	if(file_flags & UTIME) {
		archive_entry_set_mtime(entry, (time_t) mtime, 0);
	}

	if(file_flags & CRC32) {
		rar->file.stored_crc32 = crc;
	}

	if(!rar->cstate.switch_multivolume) {
		/* Do not reinitialize unpacking state if we're switching
		 * archives. */
		rar->cstate.block_parsing_finished = 1;
		rar->cstate.all_filters_applied = 1;
		rar->cstate.initialized = 0;
	}

	if(rar->generic.split_before > 0) {
		/* If now we're standing on a header that has a 'split before'
		 * mark, it means we're standing on a 'continuation' file
		 * header. Signal the caller that if it wants to move to
		 * another file, it must call rar5_read_header() function
		 * again. */

		return ARCHIVE_RETRY;
	} else {
		return ARCHIVE_OK;
	}
}